

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load_torrent.cpp
# Opt level: O1

add_torrent_params * __thiscall
libtorrent::load_torrent_buffer
          (add_torrent_params *__return_storage_ptr__,libtorrent *this,span<const_char> buffer,
          load_torrent_limits *cfg)

{
  shared_ptr<libtorrent::torrent_info> ti;
  undefined1 local_41;
  torrent_info *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_38;
  shared_ptr<libtorrent::torrent_info> local_30;
  span<const_char> local_20;
  
  local_20.m_len = (difference_type)buffer.m_ptr;
  local_40 = (torrent_info *)0x0;
  local_20.m_ptr = (char *)this;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<libtorrent::torrent_info,std::allocator<libtorrent::torrent_info>,libtorrent::span<char_const>&,libtorrent::load_torrent_limits_const&,libtorrent::from_span_t&>
            (&_Stack_38,&local_40,(allocator<libtorrent::torrent_info> *)&local_41,&local_20,
             (load_torrent_limits *)buffer.m_len,(from_span_t *)&from_span);
  add_torrent_params::add_torrent_params(__return_storage_ptr__);
  local_30.super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_40;
  local_30.super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Stack_38._M_pi;
  local_40 = (torrent_info *)0x0;
  _Stack_38._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  anon_unknown_22::update_atp(&local_30,__return_storage_ptr__);
  if (local_30.super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (_Stack_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_38._M_pi);
  }
  return __return_storage_ptr__;
}

Assistant:

add_torrent_params load_torrent_buffer(span<char const> buffer, load_torrent_limits const& cfg)
	{
		auto ti = std::make_shared<torrent_info>(buffer, cfg, from_span);
		add_torrent_params ret;
		update_atp(std::move(ti), ret);
		return ret;
	}